

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

void __thiscall
FSpecialFont::FSpecialFont
          (FSpecialFont *this,char *name,int first,int count,FTexture **lumplist,bool *notranslate,
          int lump)

{
  FTexture *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  CharData *pCVar5;
  BYTE *pBVar6;
  FFontChar1 *this_01;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  (this->super_FFont).Ranges.Array = (FRemapTable *)0x0;
  (this->super_FFont).Ranges.Most = 0;
  (this->super_FFont).Ranges.Count = 0;
  (this->super_FFont).Lump = lump;
  (this->super_FFont).Chars = (CharData *)0x0;
  (this->super_FFont).PatchRemap = (BYTE *)0x0;
  (this->super_FFont).Name = (char *)0x0;
  (this->super_FFont).Cursor = '_';
  (this->super_FFont)._vptr_FFont = (_func_int **)&PTR__FFont_006f93c0;
  memcpy(this->notranslate,notranslate,0x100);
  pcVar4 = copystring(name);
  (this->super_FFont).Name = pcVar4;
  uVar8 = 0xffffffffffffffff;
  if (-1 < count) {
    uVar8 = (ulong)(uint)count << 4;
  }
  pCVar5 = (CharData *)operator_new__(uVar8);
  (this->super_FFont).Chars = pCVar5;
  pBVar6 = (BYTE *)operator_new__(0x100);
  (this->super_FFont).PatchRemap = pBVar6;
  (this->super_FFont).FirstChar = first;
  (this->super_FFont).LastChar = count + first + -1;
  (this->super_FFont).FontHeight = 0;
  (this->super_FFont).GlobalKerning = 0;
  (this->super_FFont).Next = FFont::FirstFont;
  lVar9 = 0;
  uVar8 = 0;
  if (0 < count) {
    uVar8 = (ulong)(uint)count;
  }
  FFont::FirstFont = &this->super_FFont;
  for (; uVar8 * 8 != lVar9; lVar9 = lVar9 + 8) {
    this_00 = *(FTexture **)((long)lumplist + lVar9);
    if (this_00 == (FTexture *)0x0) {
      *(undefined8 *)((long)&pCVar5->Pic + lVar9 * 2) = 0;
      iVar3 = -0x80000000;
    }
    else {
      iVar1 = FTexture::GetScaledHeight(this_00);
      iVar2 = FTexture::GetScaledTopOffset(this_00);
      iVar3 = -iVar2;
      if (0 < iVar2) {
        iVar3 = iVar2;
      }
      if ((this->super_FFont).FontHeight < iVar3 + iVar1) {
        (this->super_FFont).FontHeight = iVar3 + iVar1;
      }
      this_01 = (FFontChar1 *)operator_new(0x70);
      FFontChar1::FFontChar1(this_01,this_00);
      *(FFontChar1 **)((long)&((this->super_FFont).Chars)->Pic + lVar9 * 2) = this_01;
      iVar3 = FTexture::GetScaledWidth((FTexture *)this_01);
      pCVar5 = (this->super_FFont).Chars;
    }
    *(int *)((long)&pCVar5->XMove + lVar9 * 2) = iVar3;
  }
  uVar7 = 0x4e - first;
  iVar3 = 4;
  if (((int)uVar7 < count && first < 0x4f) && (pCVar5[uVar7].Pic != (FTexture *)0x0)) {
    iVar3 = (pCVar5[uVar7].XMove + 1) / 2;
  }
  (this->super_FFont).SpaceWidth = iVar3;
  FFont::FixXMoves(&this->super_FFont);
  (*(this->super_FFont)._vptr_FFont[4])(this);
  return;
}

Assistant:

FSpecialFont::FSpecialFont (const char *name, int first, int count, FTexture **lumplist, const bool *notranslate, int lump) : FFont(lump)
{
	int i;
	FTexture **charlumps;
	int maxyoffs;
	FTexture *pic;

	memcpy(this->notranslate, notranslate, 256*sizeof(bool));

	Name = copystring(name);
	Chars = new CharData[count];
	charlumps = new FTexture*[count];
	PatchRemap = new BYTE[256];
	FirstChar = first;
	LastChar = first + count - 1;
	FontHeight = 0;
	GlobalKerning = false;
	Next = FirstFont;
	FirstFont = this;

	maxyoffs = 0;

	for (i = 0; i < count; i++)
	{
		pic = charlumps[i] = lumplist[i];
		if (pic != NULL)
		{
			int height = pic->GetScaledHeight();
			int yoffs = pic->GetScaledTopOffset();

			if (yoffs > maxyoffs)
			{
				maxyoffs = yoffs;
			}
			height += abs (yoffs);
			if (height > FontHeight)
			{
				FontHeight = height;
			}
		}

		if (charlumps[i] != NULL)
		{
			Chars[i].Pic = new FFontChar1 (charlumps[i]);
			Chars[i].XMove = Chars[i].Pic->GetScaledWidth();
		}
		else
		{
			Chars[i].Pic = NULL;
			Chars[i].XMove = INT_MIN;
		}
	}

	// Special fonts normally don't have all characters so be careful here!
	if ('N'-first >= 0 && 'N'-first < count && Chars['N' - first].Pic != NULL)
	{
		SpaceWidth = (Chars['N' - first].XMove + 1) / 2;
	}
	else
	{
		SpaceWidth = 4;
	}

	FixXMoves();

	LoadTranslations();

	delete[] charlumps;
}